

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmSourceFile * __thiscall
cmMakefile::GetSource(cmMakefile *this,string *sourceName,cmSourceFileLocationKind kind)

{
  undefined8 *puVar1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  cmSourceFile *unaff_RBX;
  cmSourceFile *this_00;
  undefined8 *puVar5;
  bool bVar6;
  string name;
  cmSourceFileLocation sfl;
  string local_a0;
  cmSourceFileLocation local_80;
  
  if ((kind == Known) &&
     (cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->KnownFileSearchIndex)._M_h,sourceName),
     cVar3.
     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_true>
     ._M_cur != (__node_type *)0x0)) {
    return *(cmSourceFile **)
            ((long)cVar3.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_true>
                   ._M_cur + 0x28);
  }
  cmSourceFileLocation::cmSourceFileLocation(&local_80,this,sourceName,kind);
  cmake::StripExtension(&local_a0,this->GlobalGenerator->CMakeInstance,&local_80.Name);
  cVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->SourceFileSearchIndex)._M_h,&local_a0);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    puVar5 = *(undefined8 **)
              ((long)cVar4.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_true>
                     ._M_cur + 0x28);
    puVar1 = *(undefined8 **)
              ((long)cVar4.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_true>
                     ._M_cur + 0x30);
    bVar6 = puVar5 == puVar1;
    this_00 = unaff_RBX;
    if (!bVar6) {
      do {
        this_00 = (cmSourceFile *)*puVar5;
        bVar2 = cmSourceFile::Matches(this_00,&local_80);
        if (bVar2) break;
        puVar5 = puVar5 + 1;
        bVar6 = puVar5 == puVar1;
        this_00 = unaff_RBX;
      } while (!bVar6);
    }
    if (!bVar6) goto LAB_002abc3b;
  }
  this_00 = (cmSourceFile *)0x0;
LAB_002abc3b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.Name._M_dataplus._M_p != &local_80.Name.field_2) {
    operator_delete(local_80.Name._M_dataplus._M_p,local_80.Name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.Directory._M_dataplus._M_p != &local_80.Directory.field_2) {
    operator_delete(local_80.Directory._M_dataplus._M_p,
                    local_80.Directory.field_2._M_allocated_capacity + 1);
  }
  return this_00;
}

Assistant:

cmSourceFile* cmMakefile::GetSource(const std::string& sourceName,
                                    cmSourceFileLocationKind kind) const
{
  // First check "Known" paths (avoids the creation of cmSourceFileLocation)
  if (kind == cmSourceFileLocationKind::Known) {
    auto sfsi = this->KnownFileSearchIndex.find(sourceName);
    if (sfsi != this->KnownFileSearchIndex.end()) {
      return sfsi->second;
    }
  }

  cmSourceFileLocation sfl(this, sourceName, kind);
  auto name = this->GetCMakeInstance()->StripExtension(sfl.GetName());
#if defined(_WIN32) || defined(__APPLE__)
  name = cmSystemTools::LowerCase(name);
#endif
  auto sfsi = this->SourceFileSearchIndex.find(name);
  if (sfsi != this->SourceFileSearchIndex.end()) {
    for (auto* sf : sfsi->second) {
      if (sf->Matches(sfl)) {
        return sf;
      }
    }
  }
  return nullptr;
}